

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combininglock.h
# Opt level: O0

void __thiscall
snmalloc::CombiningLockNode::attach_slow(CombiningLockNode *this,CombiningLock *lock)

{
  bool bVar1;
  LockStatus LVar2;
  __pointer_type pCVar3;
  atomic<bool> *in_RSI;
  __pointer_type in_RDI;
  __pointer_type n;
  CombiningLockNode *curr_c;
  __pointer_type n_1;
  CombiningLockNode *curr;
  __pointer_type prev;
  __pointer_type in_stack_00000048;
  __pointer_type *in_stack_00000050;
  atomic<snmalloc::CombiningLockNode_*> *in_stack_00000058;
  LockStatus in_stack_ffffffffffffffbc;
  __pointer_type in_stack_ffffffffffffffc8;
  atomic<snmalloc::CombiningLockNode_*> *in_stack_ffffffffffffffd0;
  CombiningLockNode *local_20;
  
  pCVar3 = std::atomic<snmalloc::CombiningLockNode_*>::exchange
                     ((atomic<snmalloc::CombiningLockNode_*> *)(in_RSI + 8),in_RDI,acq_rel);
  if (pCVar3 == (__pointer_type)0x0) {
    while (bVar1 = std::atomic<bool>::exchange(in_RSI,true,acquire), local_20 = in_RDI, bVar1) {
      while (bVar1 = std::atomic<bool>::load
                               ((atomic<bool> *)in_stack_ffffffffffffffc8,
                                (memory_order)((ulong)in_RDI >> 0x20)), bVar1) {
        AAL_x86::pause();
      }
    }
  }
  else {
    std::atomic<snmalloc::CombiningLockNode_*>::store
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (memory_order)((ulong)in_RDI >> 0x20));
    wait<snmalloc::PALLinux>(in_RDI);
    LVar2 = std::atomic<snmalloc::CombiningLockNode::LockStatus>::load(&in_RDI->status,acquire);
    local_20 = in_RDI;
    if (LVar2 == DONE) {
      return;
    }
  }
  while( true ) {
    pCVar3 = std::atomic<snmalloc::CombiningLockNode_*>::load
                       ((atomic<snmalloc::CombiningLockNode_*> *)in_stack_ffffffffffffffc8,
                        (memory_order)((ulong)in_RDI >> 0x20));
    AAL_Generic<snmalloc::AAL_NoStrictProvenance<snmalloc::AAL_x86>_>::prefetch(pCVar3);
    (*local_20->f_raw)(local_20);
    local_20 = std::atomic<snmalloc::CombiningLockNode_*>::load
                         ((atomic<snmalloc::CombiningLockNode_*> *)in_stack_ffffffffffffffc8,
                          (memory_order)((ulong)in_RDI >> 0x20));
    if (local_20 == (__pointer_type)0x0) break;
    wake<snmalloc::PALLinux>(in_RDI,in_stack_ffffffffffffffbc);
  }
  bVar1 = std::atomic<snmalloc::CombiningLockNode_*>::compare_exchange_strong
                    (in_stack_00000058,in_stack_00000050,in_stack_00000048,this._4_4_,
                     (memory_order)this);
  if (bVar1) {
    wake<snmalloc::PALLinux>(in_RDI,in_stack_ffffffffffffffbc);
    CombiningLock::release((CombiningLock *)0x31d681);
  }
  else {
    while (pCVar3 = std::atomic<snmalloc::CombiningLockNode_*>::load
                              ((atomic<snmalloc::CombiningLockNode_*> *)in_stack_ffffffffffffffc8,
                               (memory_order)((ulong)in_RDI >> 0x20)), pCVar3 == (__pointer_type)0x0
          ) {
      AAL_x86::pause();
    }
    std::atomic<snmalloc::CombiningLockNode_*>::load
              ((atomic<snmalloc::CombiningLockNode_*> *)in_stack_ffffffffffffffc8,
               (memory_order)((ulong)in_RDI >> 0x20));
    wake<snmalloc::PALLinux>(in_RDI,in_stack_ffffffffffffffbc);
    wake<snmalloc::PALLinux>(in_RDI,in_stack_ffffffffffffffbc);
  }
  return;
}

Assistant:

SNMALLOC_SLOW_PATH void attach_slow(CombiningLock& lock)
    {
      // There is contention for the lock, we need to add our work to the
      // queue of pending work
      auto prev = lock.last.exchange(this, stl::memory_order_acq_rel);

      if (prev != nullptr)
      {
        // If we aren't the head, link into predecessor
        prev->next.store(this, stl::memory_order_release);

        // Wait to for predecessor to complete
        wait();

        // Determine if another thread completed our work.
        if (status.load(stl::memory_order_acquire) == LockStatus::DONE)
          return;
      }
      else
      {
        // We are the head of the queue. Spin until we acquire the fast path
        // lock.  As we are in the queue future requests shouldn't try to
        // acquire the fast path lock, but stale views of the queue being empty
        // could still be concurrent with this thread.
        while (lock.flag.exchange(true, stl::memory_order_acquire))
        {
          while (lock.flag.load(stl::memory_order_relaxed))
          {
            Aal::pause();
          }
        }

        // We could set
        //    status = LockStatus::HEAD
        // However, the subsequent state assumes it is HEAD, and
        // nothing would read it.
      }

      // We are the head of the queue, and responsible for
      // waking/performing our and subsequent work.
      auto curr = this;
      while (true)
      {
        // Start pulling in the next element of the queue
        auto n = curr->next.load(stl::memory_order_acquire);
        Aal::prefetch(n);

        // Perform work for head of the queue
        curr->f_raw(curr);

        // Determine if there are more elements.
        n = curr->next.load(stl::memory_order_acquire);
        if (n == nullptr)
          break;
        // Signal this work was completed and move on to
        // next item.
        wake(curr, LockStatus::DONE);
        curr = n;
      }

      // This could be the end of the queue, attempt to close the
      // queue.
      auto curr_c = curr;
      if (lock.last.compare_exchange_strong(
            curr_c,
            nullptr,
            stl::memory_order_release,
            stl::memory_order_relaxed))
      {
        // Queue was successfully closed.
        // Notify last element the work was completed.
        wake(curr, LockStatus::DONE);
        lock.release();
        return;
      }

      // Failed to close the queue wait for next thread to be
      // added.
      while (curr->next.load(stl::memory_order_relaxed) == nullptr)
        Aal::pause();

      auto n = curr->next.load(stl::memory_order_acquire);

      // As we had to wait, give the job to the next thread
      // to carry on performing the work.
      wake(n, LockStatus::HEAD);

      // Notify the thread that we completed its work.
      // Note that this needs to be before setting curr->status,
      // as after the status is set the thread may deallocate the
      // queue node.
      wake(curr, LockStatus::DONE);
      return;
    }